

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_InitializeRingBuffer
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementSizeBytes,
          ring_buffer_size_t elementCount,void *dataPtr)

{
  void *dataPtr_local;
  ring_buffer_size_t elementCount_local;
  ring_buffer_size_t elementSizeBytes_local;
  PaUtilRingBuffer *rbuf_local;
  
  if ((elementCount - 1U & elementCount) == 0) {
    rbuf->bufferSize = elementCount;
    rbuf->buffer = (char *)dataPtr;
    PaUtil_FlushRingBuffer(rbuf);
    rbuf->bigMask = elementCount * 2 + -1;
    rbuf->smallMask = elementCount + -1;
    rbuf->elementSizeBytes = elementSizeBytes;
    rbuf_local = (PaUtilRingBuffer *)0x0;
  }
  else {
    rbuf_local = (PaUtilRingBuffer *)0xffffffffffffffff;
  }
  return (ring_buffer_size_t)rbuf_local;
}

Assistant:

ring_buffer_size_t PaUtil_InitializeRingBuffer( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementSizeBytes, ring_buffer_size_t elementCount, void *dataPtr )
{
    if( ((elementCount-1) & elementCount) != 0) return -1; /* Not Power of two. */
    rbuf->bufferSize = elementCount;
    rbuf->buffer = (char *)dataPtr;
    PaUtil_FlushRingBuffer( rbuf );
    rbuf->bigMask = (elementCount*2)-1;
    rbuf->smallMask = (elementCount)-1;
    rbuf->elementSizeBytes = elementSizeBytes;
    return 0;
}